

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::MomentumSGDTrainer::update(MomentumSGDTrainer *this,real scale)

{
  real rVar1;
  real rVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer ppPVar5;
  Parameters *this_00;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  LookupParameters *this_01;
  pointer pTVar9;
  pointer pTVar10;
  long lVar11;
  bool bVar12;
  undefined8 uVar13;
  byte bVar14;
  byte bVar15;
  pointer pSVar16;
  pointer pSVar17;
  uint uVar18;
  Index size;
  Model *pMVar19;
  _Hash_node_base *p_Var20;
  pointer ppLVar21;
  char *__function;
  Index index_3;
  ulong uVar22;
  ulong uVar23;
  Index index_7;
  uint uVar24;
  Index index;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  Index index_2;
  Index index_6;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  Index index_1;
  Index index_5;
  pointer ppPVar32;
  ushort uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  float fVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  undefined1 auVar66 [16];
  ulong local_98;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_58;
  pointer local_38;
  
  if (this->velocity_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_78,
               (this->super_Trainer).model);
    pSVar3 = (this->vp).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_64,uStack_68);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pSVar16 = (this->vp).
              super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uStack_74,local_78);
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_6c,uStack_70);
    local_78 = 0.0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar16,0);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar16 >> 0x20);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar3,0);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_58);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_78);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_78,(this->super_Trainer).model);
    pSVar4 = (this->vlp).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_64,uStack_68);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (this->vlp).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uStack_74,local_78);
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_6c,uStack_70);
    local_78 = 0.0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar17,0);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar4,0);
    local_58.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_58);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_78);
    this->velocity_allocated = true;
  }
  fVar62 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar19 = (this->super_Trainer).model;
  ppPVar32 = (pMVar19->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppPVar5 = (pMVar19->params).
            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar32 != ppPVar5) {
    auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar29 = 0;
    do {
      this_00 = *ppPVar32;
      iVar64 = 1;
      iVar63 = 1;
      uVar25 = (ulong)(this_00->values).d.nd;
      if (uVar25 != 0) {
        auVar39 = vmovdqa64_avx512f(auVar36);
        auVar40 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vmovdqa64_avx512f(auVar39);
          auVar39 = vporq_avx512f(auVar41,auVar37);
          auVar41 = vporq_avx512f(auVar41,auVar38);
          uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
          bVar14 = (byte)uVar13;
          uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
          bVar15 = (byte)uVar13;
          uVar33 = CONCAT11(bVar15,bVar14);
          auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar22));
          auVar41._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
          auVar41._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
          auVar41._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
          auVar41._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
          auVar41._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
          auVar41._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
          auVar41._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
          auVar41._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
          auVar41._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
          auVar41._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
          auVar41._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
          auVar41._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
          auVar41._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
          auVar41._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
          auVar41._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
          uVar22 = uVar22 + 0x10;
          auVar39 = vpmulld_avx512f(auVar41,auVar42);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar40._0_4_ =
             (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
        bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
        bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
        bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
        bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
        bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
        bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
        bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar40._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
        auVar40._32_4_ =
             (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
        bVar12 = (bool)(bVar15 >> 1 & 1);
        auVar40._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
        bVar12 = (bool)(bVar15 >> 2 & 1);
        auVar40._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
        bVar12 = (bool)(bVar15 >> 3 & 1);
        auVar40._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
        bVar12 = (bool)(bVar15 >> 4 & 1);
        auVar40._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
        bVar12 = (bool)(bVar15 >> 5 & 1);
        auVar40._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
        bVar12 = (bool)(bVar15 >> 6 & 1);
        auVar40._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
        auVar40._60_4_ =
             (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
        auVar35 = vextracti64x4_avx512f(auVar40,1);
        auVar39 = vpmulld_avx512f(auVar40,ZEXT3264(auVar35));
        auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar34 = vpshufd_avx(auVar66,0xee);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        auVar34 = vpshufd_avx(auVar66,0x55);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        iVar63 = auVar66._0_4_;
      }
      pSVar3 = (this->vp).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar25 = (ulong)pSVar3[uVar29].h.d.nd;
      if (uVar25 != 0) {
        auVar39 = vmovdqa64_avx512f(auVar36);
        auVar40 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vmovdqa64_avx512f(auVar39);
          auVar39 = vporq_avx512f(auVar41,auVar37);
          auVar41 = vporq_avx512f(auVar41,auVar38);
          uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
          bVar14 = (byte)uVar13;
          uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
          bVar15 = (byte)uVar13;
          uVar33 = CONCAT11(bVar15,bVar14);
          auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[uVar29].h.d.d + uVar22 * 4));
          auVar43._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
          auVar43._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
          auVar43._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
          auVar43._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
          auVar43._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
          auVar43._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
          auVar43._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
          auVar43._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
          auVar43._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
          auVar43._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
          auVar43._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
          auVar43._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
          auVar43._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
          auVar43._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
          auVar43._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
          auVar43._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
          uVar22 = uVar22 + 0x10;
          auVar39 = vpmulld_avx512f(auVar43,auVar42);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar44._0_4_ =
             (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
        bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
        bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
        bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
        bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
        bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
        bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
        bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar44._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
        auVar44._32_4_ =
             (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
        bVar12 = (bool)(bVar15 >> 1 & 1);
        auVar44._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
        bVar12 = (bool)(bVar15 >> 2 & 1);
        auVar44._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
        bVar12 = (bool)(bVar15 >> 3 & 1);
        auVar44._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
        bVar12 = (bool)(bVar15 >> 4 & 1);
        auVar44._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
        bVar12 = (bool)(bVar15 >> 5 & 1);
        auVar44._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
        bVar12 = (bool)(bVar15 >> 6 & 1);
        auVar44._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
        auVar44._60_4_ =
             (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
        auVar35 = vextracti64x4_avx512f(auVar44,1);
        auVar39 = vpmulld_avx512f(auVar44,ZEXT3264(auVar35));
        auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar34 = vpshufd_avx(auVar66,0xee);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        auVar34 = vpshufd_avx(auVar66,0x55);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        iVar64 = auVar66._0_4_;
      }
      uVar22 = (ulong)(this_00->g).d.nd;
      if (uVar22 == 0) {
        iVar65 = 1;
      }
      else {
        auVar39 = vmovdqa64_avx512f(auVar36);
        auVar40 = vpbroadcastq_avx512f();
        uVar28 = 0;
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vmovdqa64_avx512f(auVar39);
          auVar39 = vporq_avx512f(auVar41,auVar37);
          auVar41 = vporq_avx512f(auVar41,auVar38);
          uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
          bVar14 = (byte)uVar13;
          uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
          bVar15 = (byte)uVar13;
          uVar33 = CONCAT11(bVar15,bVar14);
          auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar28));
          auVar45._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
          auVar45._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
          auVar45._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
          auVar45._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
          auVar45._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
          auVar45._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
          auVar45._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
          auVar45._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
          auVar45._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
          auVar45._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
          auVar45._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
          auVar45._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
          auVar45._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
          auVar45._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
          auVar45._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
          auVar45._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
          uVar28 = uVar28 + 0x10;
          auVar39 = vpmulld_avx512f(auVar45,auVar42);
        } while ((uVar22 + 0xf & 0x1fffffff0) != uVar28);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar46._0_4_ =
             (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
        bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
        bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
        bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
        bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
        bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
        bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
        bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar46._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
        auVar46._32_4_ =
             (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
        bVar12 = (bool)(bVar15 >> 1 & 1);
        auVar46._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
        bVar12 = (bool)(bVar15 >> 2 & 1);
        auVar46._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
        bVar12 = (bool)(bVar15 >> 3 & 1);
        auVar46._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
        bVar12 = (bool)(bVar15 >> 4 & 1);
        auVar46._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
        bVar12 = (bool)(bVar15 >> 5 & 1);
        auVar46._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
        bVar12 = (bool)(bVar15 >> 6 & 1);
        auVar46._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
        auVar46._60_4_ =
             (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
        auVar35 = vextracti64x4_avx512f(auVar46,1);
        auVar39 = vpmulld_avx512f(auVar46,ZEXT3264(auVar35));
        auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar34 = vpshufd_avx(auVar66,0xee);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        auVar34 = vpshufd_avx(auVar66,0x55);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        iVar65 = auVar66._0_4_;
      }
      uVar18 = pSVar3[uVar29].h.d.bd;
      uVar27 = iVar65 * (this_00->g).d.bd;
      uVar22 = (ulong)uVar27;
      uVar24 = iVar64 * uVar18;
      if (uVar24 != uVar27) goto LAB_00228bec;
      if (uVar25 == 0) {
        iVar64 = 1;
      }
      else {
        auVar39 = vmovdqa64_avx512f(auVar36);
        auVar40 = vpbroadcastq_avx512f();
        uVar28 = 0;
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vmovdqa64_avx512f(auVar39);
          auVar39 = vporq_avx512f(auVar41,auVar37);
          auVar41 = vporq_avx512f(auVar41,auVar38);
          uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
          bVar14 = (byte)uVar13;
          uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
          bVar15 = (byte)uVar13;
          uVar33 = CONCAT11(bVar15,bVar14);
          auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[uVar29].h.d.d + uVar28 * 4));
          auVar47._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
          auVar47._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
          auVar47._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
          auVar47._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
          auVar47._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
          auVar47._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
          auVar47._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
          auVar47._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
          auVar47._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
          auVar47._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
          auVar47._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
          auVar47._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
          auVar47._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
          auVar47._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
          auVar47._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
          auVar47._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
          uVar28 = uVar28 + 0x10;
          auVar39 = vpmulld_avx512f(auVar47,auVar42);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar28);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar48._0_4_ =
             (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
        bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
        bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
        bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
        bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
        bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
        bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
        bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar48._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
        auVar48._32_4_ =
             (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
        bVar12 = (bool)(bVar15 >> 1 & 1);
        auVar48._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
        bVar12 = (bool)(bVar15 >> 2 & 1);
        auVar48._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
        bVar12 = (bool)(bVar15 >> 3 & 1);
        auVar48._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
        bVar12 = (bool)(bVar15 >> 4 & 1);
        auVar48._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
        bVar12 = (bool)(bVar15 >> 5 & 1);
        auVar48._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
        bVar12 = (bool)(bVar15 >> 6 & 1);
        auVar48._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
        auVar48._60_4_ =
             (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
        auVar35 = vextracti64x4_avx512f(auVar48,1);
        auVar39 = vpmulld_avx512f(auVar48,ZEXT3264(auVar35));
        auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar34 = vpshufd_avx(auVar66,0xee);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        auVar34 = vpshufd_avx(auVar66,0x55);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        iVar64 = auVar66._0_4_;
      }
      uVar27 = iVar63 * (this_00->values).d.bd;
      pfVar6 = (this_00->values).v;
      pfVar7 = pSVar3[uVar29].h.v;
      local_78 = fVar62 * scale * (this->super_Trainer).eta;
      rVar1 = (this->super_Trainer).lambda;
      rVar2 = this->momentum;
      pfVar8 = (this_00->g).v;
      local_58.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_58.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,rVar2);
      local_58.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar7,0);
      local_58.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pfVar7 >> 0x20);
      uStack_6c = SUB84(pfVar8,0);
      uStack_68 = (undefined4)((ulong)pfVar8 >> 0x20);
      if (iVar64 * uVar18 != uVar24) {
LAB_00228bca:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                     );
      }
      uVar25 = uVar22;
      if ((((ulong)pfVar7 & 3) == 0) &&
         (uVar25 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 0xf), uVar22 <= uVar25)) {
        uVar25 = uVar22;
      }
      uVar23 = uVar22 - uVar25;
      uVar28 = uVar23 + 0xf;
      if (-1 < (long)uVar23) {
        uVar28 = uVar23;
      }
      if (uVar25 != 0) {
        uVar30 = 0;
        do {
          auVar66 = vfmsub231ss_fma(ZEXT416((uint)(local_78 * pfVar8[uVar30])),ZEXT416((uint)rVar2),
                                    ZEXT416((uint)pfVar7[uVar30]));
          pfVar7[uVar30] = auVar66._0_4_;
          uVar30 = uVar30 + 1;
        } while (uVar25 != uVar30);
      }
      uVar28 = (uVar28 & 0xfffffffffffffff0) + uVar25;
      if (0xf < (long)uVar23) {
        auVar39 = vbroadcastss_avx512f(ZEXT416((uint)rVar2));
        auVar40 = vbroadcastss_avx512f(ZEXT416((uint)local_78));
        do {
          auVar41 = vmulps_avx512f(auVar40,*(undefined1 (*) [64])(pfVar8 + uVar25));
          auVar41 = vfmsub231ps_avx512f(auVar41,auVar39,*(undefined1 (*) [64])(pfVar7 + uVar25));
          *(undefined1 (*) [64])(pfVar7 + uVar25) = auVar41;
          uVar25 = uVar25 + 0x10;
        } while ((long)uVar25 < (long)uVar28);
      }
      if ((long)uVar28 < (long)uVar22) {
        do {
          auVar66 = vfmsub231ss_fma(ZEXT416((uint)(local_78 * pfVar8[uVar28])),ZEXT416((uint)rVar2),
                                    ZEXT416((uint)pfVar7[uVar28]));
          pfVar7[uVar28] = auVar66._0_4_;
          uVar28 = uVar28 + 1;
        } while (uVar22 != uVar28);
      }
      pfVar7 = pSVar3[uVar29].h.v;
      uVar25 = (ulong)pSVar3[uVar29].h.d.nd;
      if (uVar25 == 0) {
        iVar63 = 1;
      }
      else {
        auVar39 = vmovdqa64_avx512f(auVar36);
        auVar40 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vmovdqa64_avx512f(auVar39);
          auVar39 = vporq_avx512f(auVar41,auVar37);
          auVar41 = vporq_avx512f(auVar41,auVar38);
          uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
          bVar14 = (byte)uVar13;
          uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
          bVar15 = (byte)uVar13;
          uVar33 = CONCAT11(bVar15,bVar14);
          auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[uVar29].h.d.d + uVar22 * 4));
          auVar39._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar41._4_4_;
          auVar39._0_4_ = (uint)(bVar14 & 1) * auVar41._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar41._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar41._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar41._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar41._20_4_;
          auVar39._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar41._24_4_;
          auVar39._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar41._28_4_;
          auVar39._32_4_ = (uint)(bVar15 & 1) * auVar41._32_4_;
          auVar39._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar41._36_4_;
          auVar39._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar41._40_4_;
          auVar39._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar41._44_4_;
          auVar39._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar41._48_4_;
          auVar39._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar41._52_4_;
          auVar39._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar41._56_4_;
          auVar39._60_4_ = (uint)(bVar15 >> 7) * auVar41._60_4_;
          uVar22 = uVar22 + 0x10;
          auVar39 = vpmulld_avx512f(auVar39,auVar42);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
        auVar39 = vmovdqa32_avx512f(auVar39);
        auVar49._0_4_ =
             (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
        bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
        bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
        bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
        bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
        bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
        bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
        bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar49._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
        auVar49._32_4_ =
             (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
        bVar12 = (bool)(bVar15 >> 1 & 1);
        auVar49._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
        bVar12 = (bool)(bVar15 >> 2 & 1);
        auVar49._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
        bVar12 = (bool)(bVar15 >> 3 & 1);
        auVar49._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
        bVar12 = (bool)(bVar15 >> 4 & 1);
        auVar49._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
        bVar12 = (bool)(bVar15 >> 5 & 1);
        auVar49._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
        bVar12 = (bool)(bVar15 >> 6 & 1);
        auVar49._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
        auVar49._60_4_ =
             (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
        auVar35 = vextracti64x4_avx512f(auVar49,1);
        auVar39 = vpmulld_avx512f(auVar49,ZEXT3264(auVar35));
        auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
        auVar34 = vpshufd_avx(auVar66,0xee);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        auVar34 = vpshufd_avx(auVar66,0x55);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        iVar63 = auVar66._0_4_;
      }
      if (iVar63 * pSVar3[uVar29].h.d.bd != uVar27) goto LAB_00228c03;
      uVar25 = (ulong)(this_00->values).d.nd;
      if (uVar25 == 0) {
        iVar63 = 1;
      }
      else {
        auVar36 = vmovdqa64_avx512f(auVar36);
        auVar39 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar40 = vpbroadcastq_avx512f();
          auVar41 = vmovdqa64_avx512f(auVar36);
          auVar36 = vporq_avx512f(auVar40,auVar37);
          auVar40 = vporq_avx512f(auVar40,auVar38);
          uVar13 = vpcmpuq_avx512f(auVar40,auVar39,2);
          bVar14 = (byte)uVar13;
          uVar13 = vpcmpuq_avx512f(auVar36,auVar39,2);
          bVar15 = (byte)uVar13;
          uVar33 = CONCAT11(bVar15,bVar14);
          auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar22));
          auVar42._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar36._4_4_;
          auVar42._0_4_ = (uint)(bVar14 & 1) * auVar36._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar36._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar36._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar36._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar36._20_4_;
          auVar42._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar36._24_4_;
          auVar42._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar36._28_4_;
          auVar42._32_4_ = (uint)(bVar15 & 1) * auVar36._32_4_;
          auVar42._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar36._36_4_;
          auVar42._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar36._40_4_;
          auVar42._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar36._44_4_;
          auVar42._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar36._48_4_;
          auVar42._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar36._52_4_;
          auVar42._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar36._56_4_;
          auVar42._60_4_ = (uint)(bVar15 >> 7) * auVar36._60_4_;
          uVar22 = uVar22 + 0x10;
          auVar36 = vpmulld_avx512f(auVar42,auVar41);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
        auVar36 = vmovdqa32_avx512f(auVar36);
        auVar37._0_4_ =
             (uint)(bVar14 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar41._0_4_;
        bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar12 * auVar36._4_4_ | (uint)!bVar12 * auVar41._4_4_;
        bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar37._8_4_ = (uint)bVar12 * auVar36._8_4_ | (uint)!bVar12 * auVar41._8_4_;
        bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar37._12_4_ = (uint)bVar12 * auVar36._12_4_ | (uint)!bVar12 * auVar41._12_4_;
        bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar37._16_4_ = (uint)bVar12 * auVar36._16_4_ | (uint)!bVar12 * auVar41._16_4_;
        bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar37._20_4_ = (uint)bVar12 * auVar36._20_4_ | (uint)!bVar12 * auVar41._20_4_;
        bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar37._24_4_ = (uint)bVar12 * auVar36._24_4_ | (uint)!bVar12 * auVar41._24_4_;
        bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar37._28_4_ = (uint)bVar12 * auVar36._28_4_ | (uint)!bVar12 * auVar41._28_4_;
        auVar37._32_4_ =
             (uint)(bVar15 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar41._32_4_;
        bVar12 = (bool)(bVar15 >> 1 & 1);
        auVar37._36_4_ = (uint)bVar12 * auVar36._36_4_ | (uint)!bVar12 * auVar41._36_4_;
        bVar12 = (bool)(bVar15 >> 2 & 1);
        auVar37._40_4_ = (uint)bVar12 * auVar36._40_4_ | (uint)!bVar12 * auVar41._40_4_;
        bVar12 = (bool)(bVar15 >> 3 & 1);
        auVar37._44_4_ = (uint)bVar12 * auVar36._44_4_ | (uint)!bVar12 * auVar41._44_4_;
        bVar12 = (bool)(bVar15 >> 4 & 1);
        auVar37._48_4_ = (uint)bVar12 * auVar36._48_4_ | (uint)!bVar12 * auVar41._48_4_;
        bVar12 = (bool)(bVar15 >> 5 & 1);
        auVar37._52_4_ = (uint)bVar12 * auVar36._52_4_ | (uint)!bVar12 * auVar41._52_4_;
        bVar12 = (bool)(bVar15 >> 6 & 1);
        auVar37._56_4_ = (uint)bVar12 * auVar36._56_4_ | (uint)!bVar12 * auVar41._56_4_;
        auVar37._60_4_ =
             (uint)(bVar15 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar41._60_4_;
        auVar35 = vextracti64x4_avx512f(auVar37,1);
        auVar36 = vpmulld_avx512f(auVar37,ZEXT3264(auVar35));
        auVar66 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
        auVar34 = vpshufd_avx(auVar66,0xee);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        auVar34 = vpshufd_avx(auVar66,0x55);
        auVar66 = vpmulld_avx(auVar66,auVar34);
        iVar63 = auVar66._0_4_;
      }
      uVar18 = iVar63 * (this_00->values).d.bd;
      uVar25 = (ulong)uVar18;
      if (uVar18 != uVar27) {
LAB_00228ba8:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      pfVar8 = (this_00->values).v;
      uVar22 = uVar25;
      if ((((ulong)pfVar8 & 3) == 0) &&
         (uVar22 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 0xf), uVar25 <= uVar22)) {
        uVar22 = uVar25;
      }
      uVar23 = uVar25 - uVar22;
      uVar28 = uVar23 + 0xf;
      if (-1 < (long)uVar23) {
        uVar28 = uVar23;
      }
      auVar66 = ZEXT416((uint)rVar1);
      if (uVar22 != 0) {
        uVar30 = 0;
        do {
          auVar34 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar30]),auVar66,
                                     ZEXT416((uint)pfVar7[uVar30]));
          pfVar8[uVar30] = auVar34._0_4_ + pfVar8[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar22 != uVar30);
      }
      uVar28 = (uVar28 & 0xfffffffffffffff0) + uVar22;
      if (0xf < (long)uVar23) {
        auVar34._8_4_ = 0x80000000;
        auVar34._0_8_ = 0x8000000080000000;
        auVar34._12_4_ = 0x80000000;
        auVar34 = vxorps_avx512vl(auVar66,auVar34);
        auVar36 = vbroadcastss_avx512f(auVar34);
        do {
          auVar37 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar8 + uVar22),
                                   *(undefined1 (*) [64])(pfVar7 + uVar22));
          auVar37 = vfmadd231ps_avx512f(auVar37,auVar36,*(undefined1 (*) [64])(pfVar6 + uVar22));
          *(undefined1 (*) [64])(pfVar8 + uVar22) = auVar37;
          uVar22 = uVar22 + 0x10;
        } while ((long)uVar22 < (long)uVar28);
      }
      if ((long)uVar28 < (long)uVar25) {
        do {
          auVar34 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar28]),auVar66,
                                     ZEXT416((uint)pfVar7[uVar28]));
          pfVar8[uVar28] = auVar34._0_4_ + pfVar8[uVar28];
          uVar28 = uVar28 + 1;
        } while (uVar25 != uVar28);
      }
      uVar29 = (ulong)((int)uVar29 + 1);
      Parameters::clear(this_00);
      auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      ppPVar32 = ppPVar32 + 1;
    } while (ppPVar32 != ppPVar5);
    pMVar19 = (this->super_Trainer).model;
  }
  ppLVar21 = (pMVar19->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_38 = (pMVar19->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar21 != local_38) {
    auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_98 = 0;
    do {
      this_01 = *ppLVar21;
      p_Var20 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var20 != (_Hash_node_base *)0x0) {
        pSVar4 = (this->vlp).
                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar29 = (ulong)*(uint *)&p_Var20[1]._M_nxt;
          pTVar9 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar64 = 1;
          iVar63 = 1;
          uVar25 = (ulong)pTVar9[uVar29].d.nd;
          if (uVar25 != 0) {
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar40 = vpbroadcastq_avx512f();
            uVar22 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vmovdqa64_avx512f(auVar39);
              auVar39 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
              bVar14 = (byte)uVar13;
              uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
              bVar15 = (byte)uVar13;
              uVar33 = CONCAT11(bVar15,bVar14);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar9[uVar29].d.d + uVar22));
              auVar50._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
              auVar50._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
              auVar50._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
              auVar50._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
              auVar50._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
              auVar50._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
              auVar50._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
              auVar50._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
              auVar50._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
              auVar50._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
              auVar50._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
              auVar50._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
              auVar50._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
              auVar50._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
              auVar50._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
              auVar50._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
              uVar22 = uVar22 + 0x10;
              auVar39 = vpmulld_avx512f(auVar50,auVar42);
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
            auVar39 = vmovdqa32_avx512f(auVar39);
            auVar51._0_4_ =
                 (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
            bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
            bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
            bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
            auVar51._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
            bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
            auVar51._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
            bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
            auVar51._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
            bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
            auVar51._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
            bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
            auVar51._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
            auVar51._32_4_ =
                 (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
            bVar12 = (bool)(bVar15 >> 1 & 1);
            auVar51._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
            bVar12 = (bool)(bVar15 >> 2 & 1);
            auVar51._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
            bVar12 = (bool)(bVar15 >> 3 & 1);
            auVar51._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
            bVar12 = (bool)(bVar15 >> 4 & 1);
            auVar51._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
            bVar12 = (bool)(bVar15 >> 5 & 1);
            auVar51._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar51._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
            auVar51._60_4_ =
                 (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
            auVar35 = vextracti64x4_avx512f(auVar51,1);
            auVar39 = vpmulld_avx512f(auVar51,ZEXT3264(auVar35));
            auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar34 = vpshufd_avx(auVar66,0xee);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            auVar34 = vpshufd_avx(auVar66,0x55);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            iVar63 = auVar66._0_4_;
          }
          lVar26 = *(long *)&pSVar4[local_98].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar29 * 0x48;
          uVar25 = (ulong)*(uint *)(lVar26 + 0x1c);
          if (uVar25 != 0) {
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar40 = vpbroadcastq_avx512f();
            uVar22 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vmovdqa64_avx512f(auVar39);
              auVar39 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
              bVar14 = (byte)uVar13;
              uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
              bVar15 = (byte)uVar13;
              uVar33 = CONCAT11(bVar15,bVar14);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar26 + uVar22 * 4));
              auVar52._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
              auVar52._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
              auVar52._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
              auVar52._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
              auVar52._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
              auVar52._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
              auVar52._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
              auVar52._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
              auVar52._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
              auVar52._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
              auVar52._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
              auVar52._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
              auVar52._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
              auVar52._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
              auVar52._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
              auVar52._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
              uVar22 = uVar22 + 0x10;
              auVar39 = vpmulld_avx512f(auVar52,auVar42);
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
            auVar39 = vmovdqa32_avx512f(auVar39);
            auVar53._0_4_ =
                 (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
            bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
            bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
            bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
            auVar53._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
            bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
            auVar53._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
            bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
            auVar53._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
            bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
            auVar53._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
            bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
            auVar53._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
            auVar53._32_4_ =
                 (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
            bVar12 = (bool)(bVar15 >> 1 & 1);
            auVar53._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
            bVar12 = (bool)(bVar15 >> 2 & 1);
            auVar53._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
            bVar12 = (bool)(bVar15 >> 3 & 1);
            auVar53._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
            bVar12 = (bool)(bVar15 >> 4 & 1);
            auVar53._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
            bVar12 = (bool)(bVar15 >> 5 & 1);
            auVar53._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar53._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
            auVar53._60_4_ =
                 (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
            auVar35 = vextracti64x4_avx512f(auVar53,1);
            auVar39 = vpmulld_avx512f(auVar53,ZEXT3264(auVar35));
            auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar34 = vpshufd_avx(auVar66,0xee);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            auVar34 = vpshufd_avx(auVar66,0x55);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            iVar64 = auVar66._0_4_;
          }
          pTVar10 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar22 = (ulong)pTVar10[uVar29].d.nd;
          if (uVar22 == 0) {
            iVar65 = 1;
          }
          else {
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar40 = vpbroadcastq_avx512f();
            uVar28 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vmovdqa64_avx512f(auVar39);
              auVar39 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
              bVar14 = (byte)uVar13;
              uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
              bVar15 = (byte)uVar13;
              uVar33 = CONCAT11(bVar15,bVar14);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar10[uVar29].d.d + uVar28));
              auVar54._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
              auVar54._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
              auVar54._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
              auVar54._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
              auVar54._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
              auVar54._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
              auVar54._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
              auVar54._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
              auVar54._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
              auVar54._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
              auVar54._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
              auVar54._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
              auVar54._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
              auVar54._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
              auVar54._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
              auVar54._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar39 = vpmulld_avx512f(auVar54,auVar42);
            } while ((uVar22 + 0xf & 0x1fffffff0) != uVar28);
            auVar39 = vmovdqa32_avx512f(auVar39);
            auVar55._0_4_ =
                 (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
            bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
            bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
            bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
            auVar55._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
            bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
            auVar55._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
            bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
            auVar55._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
            bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
            auVar55._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
            bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
            auVar55._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
            auVar55._32_4_ =
                 (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
            bVar12 = (bool)(bVar15 >> 1 & 1);
            auVar55._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
            bVar12 = (bool)(bVar15 >> 2 & 1);
            auVar55._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
            bVar12 = (bool)(bVar15 >> 3 & 1);
            auVar55._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
            bVar12 = (bool)(bVar15 >> 4 & 1);
            auVar55._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
            bVar12 = (bool)(bVar15 >> 5 & 1);
            auVar55._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar55._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
            auVar55._60_4_ =
                 (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
            auVar35 = vextracti64x4_avx512f(auVar55,1);
            auVar39 = vpmulld_avx512f(auVar55,ZEXT3264(auVar35));
            auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar34 = vpshufd_avx(auVar66,0xee);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            auVar34 = vpshufd_avx(auVar66,0x55);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            iVar65 = auVar66._0_4_;
          }
          uVar24 = iVar65 * pTVar10[uVar29].d.bd;
          uVar22 = (ulong)uVar24;
          uVar18 = iVar64 * *(int *)(lVar26 + 0x20);
          if (uVar18 != uVar24) goto LAB_00228bec;
          if (uVar25 == 0) {
            iVar64 = 1;
          }
          else {
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar40 = vpbroadcastq_avx512f();
            uVar28 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vmovdqa64_avx512f(auVar39);
              auVar39 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
              bVar14 = (byte)uVar13;
              uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
              bVar15 = (byte)uVar13;
              uVar33 = CONCAT11(bVar15,bVar14);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar26 + uVar28 * 4));
              auVar56._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
              auVar56._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
              auVar56._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
              auVar56._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
              auVar56._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
              auVar56._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
              auVar56._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
              auVar56._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
              auVar56._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
              auVar56._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
              auVar56._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
              auVar56._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
              auVar56._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
              auVar56._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
              auVar56._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
              auVar56._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar39 = vpmulld_avx512f(auVar56,auVar42);
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar28);
            auVar39 = vmovdqa32_avx512f(auVar39);
            auVar57._0_4_ =
                 (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
            bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar57._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
            bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar57._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
            bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
            auVar57._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
            bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
            auVar57._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
            bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
            auVar57._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
            bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
            auVar57._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
            bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
            auVar57._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
            auVar57._32_4_ =
                 (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
            bVar12 = (bool)(bVar15 >> 1 & 1);
            auVar57._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
            bVar12 = (bool)(bVar15 >> 2 & 1);
            auVar57._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
            bVar12 = (bool)(bVar15 >> 3 & 1);
            auVar57._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
            bVar12 = (bool)(bVar15 >> 4 & 1);
            auVar57._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
            bVar12 = (bool)(bVar15 >> 5 & 1);
            auVar57._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar57._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
            auVar57._60_4_ =
                 (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
            auVar35 = vextracti64x4_avx512f(auVar57,1);
            auVar39 = vpmulld_avx512f(auVar57,ZEXT3264(auVar35));
            auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar34 = vpshufd_avx(auVar66,0xee);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            auVar34 = vpshufd_avx(auVar66,0x55);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            iVar64 = auVar66._0_4_;
          }
          uVar24 = iVar63 * pTVar9[uVar29].d.bd;
          pfVar6 = pTVar9[uVar29].v;
          uVar25 = *(ulong *)(lVar26 + 0x28);
          pfVar7 = pTVar10[uVar29].v;
          local_78 = fVar62 * scale * (this->super_Trainer).eta;
          rVar1 = (this->super_Trainer).lambda;
          rVar2 = this->momentum;
          local_58.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_58.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,rVar2);
          local_58.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)uVar25;
          local_58.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)(uVar25 >> 0x20);
          uStack_6c = SUB84(pfVar7,0);
          uStack_68 = (undefined4)((ulong)pfVar7 >> 0x20);
          if (iVar64 * *(int *)(lVar26 + 0x20) != uVar18) goto LAB_00228bca;
          uVar28 = uVar22;
          if (((uVar25 & 3) == 0) &&
             (uVar28 = (ulong)(-((uint)(uVar25 >> 2) & 0x3fffffff) & 0xf), uVar22 <= uVar28)) {
            uVar28 = uVar22;
          }
          uVar30 = uVar22 - uVar28;
          uVar23 = uVar30 + 0xf;
          if (-1 < (long)uVar30) {
            uVar23 = uVar30;
          }
          if (uVar28 != 0) {
            uVar31 = 0;
            do {
              auVar66 = vfmsub231ss_fma(ZEXT416((uint)(local_78 * pfVar7[uVar31])),
                                        ZEXT416((uint)rVar2),ZEXT416(*(uint *)(uVar25 + uVar31 * 4))
                                       );
              *(int *)(uVar25 + uVar31 * 4) = auVar66._0_4_;
              uVar31 = uVar31 + 1;
            } while (uVar28 != uVar31);
          }
          uVar23 = (uVar23 & 0xfffffffffffffff0) + uVar28;
          if (0xf < (long)uVar30) {
            auVar39 = vbroadcastss_avx512f(ZEXT416((uint)rVar2));
            auVar40 = vbroadcastss_avx512f(ZEXT416((uint)local_78));
            do {
              auVar41 = vmulps_avx512f(auVar40,*(undefined1 (*) [64])(pfVar7 + uVar28));
              auVar41 = vfmsub231ps_avx512f(auVar41,auVar39,
                                            *(undefined1 (*) [64])(uVar25 + uVar28 * 4));
              *(undefined1 (*) [64])(uVar25 + uVar28 * 4) = auVar41;
              uVar28 = uVar28 + 0x10;
            } while ((long)uVar28 < (long)uVar23);
          }
          if ((long)uVar23 < (long)uVar22) {
            do {
              auVar66 = vfmsub231ss_fma(ZEXT416((uint)(local_78 * pfVar7[uVar23])),
                                        ZEXT416((uint)rVar2),ZEXT416(*(uint *)(uVar25 + uVar23 * 4))
                                       );
              *(int *)(uVar25 + uVar23 * 4) = auVar66._0_4_;
              uVar23 = uVar23 + 1;
            } while (uVar22 != uVar23);
          }
          lVar11 = *(long *)(lVar26 + 0x28);
          if ((ulong)*(uint *)(lVar26 + 0x1c) == 0) {
            iVar63 = 1;
          }
          else {
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar40 = vpbroadcastq_avx512f();
            uVar25 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vmovdqa64_avx512f(auVar39);
              auVar39 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
              bVar14 = (byte)uVar13;
              uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
              bVar15 = (byte)uVar13;
              uVar33 = CONCAT11(bVar15,bVar14);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar26 + uVar25 * 4));
              auVar58._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
              auVar58._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
              auVar58._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
              auVar58._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
              auVar58._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
              auVar58._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
              auVar58._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
              auVar58._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
              auVar58._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
              auVar58._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
              auVar58._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
              auVar58._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
              auVar58._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
              auVar58._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
              auVar58._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
              auVar58._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
              uVar25 = uVar25 + 0x10;
              auVar39 = vpmulld_avx512f(auVar58,auVar42);
            } while (((ulong)*(uint *)(lVar26 + 0x1c) + 0xf & 0x1fffffff0) != uVar25);
            auVar39 = vmovdqa32_avx512f(auVar39);
            auVar59._0_4_ =
                 (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
            bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar59._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
            bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar59._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
            bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
            auVar59._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
            bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
            auVar59._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
            bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
            auVar59._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
            bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
            auVar59._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
            bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
            auVar59._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
            auVar59._32_4_ =
                 (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
            bVar12 = (bool)(bVar15 >> 1 & 1);
            auVar59._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
            bVar12 = (bool)(bVar15 >> 2 & 1);
            auVar59._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
            bVar12 = (bool)(bVar15 >> 3 & 1);
            auVar59._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
            bVar12 = (bool)(bVar15 >> 4 & 1);
            auVar59._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
            bVar12 = (bool)(bVar15 >> 5 & 1);
            auVar59._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar59._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
            auVar59._60_4_ =
                 (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
            auVar35 = vextracti64x4_avx512f(auVar59,1);
            auVar39 = vpmulld_avx512f(auVar59,ZEXT3264(auVar35));
            auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar34 = vpshufd_avx(auVar66,0xee);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            auVar34 = vpshufd_avx(auVar66,0x55);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            iVar63 = auVar66._0_4_;
          }
          if (iVar63 * *(int *)(lVar26 + 0x20) != uVar24) goto LAB_00228c03;
          pTVar9 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar25 = (ulong)pTVar9[uVar29].d.nd;
          if (uVar25 == 0) {
            iVar63 = 1;
          }
          else {
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar40 = vpbroadcastq_avx512f();
            uVar22 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vmovdqa64_avx512f(auVar39);
              auVar39 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar13 = vpcmpuq_avx512f(auVar41,auVar40,2);
              bVar14 = (byte)uVar13;
              uVar13 = vpcmpuq_avx512f(auVar39,auVar40,2);
              bVar15 = (byte)uVar13;
              uVar33 = CONCAT11(bVar15,bVar14);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar9[uVar29].d.d + uVar22));
              auVar60._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * auVar39._4_4_;
              auVar60._0_4_ = (uint)(bVar14 & 1) * auVar39._0_4_;
              auVar60._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * auVar39._8_4_;
              auVar60._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * auVar39._12_4_;
              auVar60._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * auVar39._16_4_;
              auVar60._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * auVar39._20_4_;
              auVar60._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * auVar39._24_4_;
              auVar60._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * auVar39._28_4_;
              auVar60._32_4_ = (uint)(bVar15 & 1) * auVar39._32_4_;
              auVar60._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar39._36_4_;
              auVar60._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar39._40_4_;
              auVar60._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar39._44_4_;
              auVar60._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar39._48_4_;
              auVar60._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar39._52_4_;
              auVar60._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar39._56_4_;
              auVar60._60_4_ = (uint)(bVar15 >> 7) * auVar39._60_4_;
              uVar22 = uVar22 + 0x10;
              auVar39 = vpmulld_avx512f(auVar60,auVar42);
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar22);
            auVar39 = vmovdqa32_avx512f(auVar39);
            auVar61._0_4_ =
                 (uint)(bVar14 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar14 & 1) * auVar42._0_4_;
            bVar12 = (bool)((byte)(uVar33 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar42._4_4_;
            bVar12 = (bool)((byte)(uVar33 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar42._8_4_;
            bVar12 = (bool)((byte)(uVar33 >> 3) & 1);
            auVar61._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar42._12_4_;
            bVar12 = (bool)((byte)(uVar33 >> 4) & 1);
            auVar61._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * auVar42._16_4_;
            bVar12 = (bool)((byte)(uVar33 >> 5) & 1);
            auVar61._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * auVar42._20_4_;
            bVar12 = (bool)((byte)(uVar33 >> 6) & 1);
            auVar61._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * auVar42._24_4_;
            bVar12 = (bool)((byte)(uVar33 >> 7) & 1);
            auVar61._28_4_ = (uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * auVar42._28_4_;
            auVar61._32_4_ =
                 (uint)(bVar15 & 1) * auVar39._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar42._32_4_;
            bVar12 = (bool)(bVar15 >> 1 & 1);
            auVar61._36_4_ = (uint)bVar12 * auVar39._36_4_ | (uint)!bVar12 * auVar42._36_4_;
            bVar12 = (bool)(bVar15 >> 2 & 1);
            auVar61._40_4_ = (uint)bVar12 * auVar39._40_4_ | (uint)!bVar12 * auVar42._40_4_;
            bVar12 = (bool)(bVar15 >> 3 & 1);
            auVar61._44_4_ = (uint)bVar12 * auVar39._44_4_ | (uint)!bVar12 * auVar42._44_4_;
            bVar12 = (bool)(bVar15 >> 4 & 1);
            auVar61._48_4_ = (uint)bVar12 * auVar39._48_4_ | (uint)!bVar12 * auVar42._48_4_;
            bVar12 = (bool)(bVar15 >> 5 & 1);
            auVar61._52_4_ = (uint)bVar12 * auVar39._52_4_ | (uint)!bVar12 * auVar42._52_4_;
            bVar12 = (bool)(bVar15 >> 6 & 1);
            auVar61._56_4_ = (uint)bVar12 * auVar39._56_4_ | (uint)!bVar12 * auVar42._56_4_;
            auVar61._60_4_ =
                 (uint)(bVar15 >> 7) * auVar39._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar42._60_4_;
            auVar35 = vextracti64x4_avx512f(auVar61,1);
            auVar39 = vpmulld_avx512f(auVar61,ZEXT3264(auVar35));
            auVar66 = vpmulld_avx(auVar39._0_16_,auVar39._16_16_);
            auVar34 = vpshufd_avx(auVar66,0xee);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            auVar34 = vpshufd_avx(auVar66,0x55);
            auVar66 = vpmulld_avx(auVar66,auVar34);
            iVar63 = auVar66._0_4_;
          }
          uVar18 = iVar63 * pTVar9[uVar29].d.bd;
          uVar25 = (ulong)uVar18;
          if (uVar18 != uVar24) goto LAB_00228ba8;
          pfVar7 = pTVar9[uVar29].v;
          uVar29 = uVar25;
          if ((((ulong)pfVar7 & 3) == 0) &&
             (uVar29 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 0xf), uVar25 <= uVar29))
          {
            uVar29 = uVar25;
          }
          uVar28 = uVar25 - uVar29;
          uVar22 = uVar28 + 0xf;
          if (-1 < (long)uVar28) {
            uVar22 = uVar28;
          }
          if (uVar29 != 0) {
            uVar23 = 0;
            do {
              auVar66 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar23]),ZEXT416((uint)rVar1),
                                         ZEXT416(*(uint *)(lVar11 + uVar23 * 4)));
              pfVar7[uVar23] = auVar66._0_4_ + pfVar7[uVar23];
              uVar23 = uVar23 + 1;
            } while (uVar29 != uVar23);
          }
          uVar22 = (uVar22 & 0xfffffffffffffff0) + uVar29;
          if (0xf < (long)uVar28) {
            auVar66._0_4_ = -rVar1;
            auVar66._4_4_ = 0x80000000;
            auVar66._8_4_ = 0x80000000;
            auVar66._12_4_ = 0x80000000;
            auVar39 = vbroadcastss_avx512f(auVar66);
            do {
              auVar40 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar29),
                                       *(undefined1 (*) [64])(lVar11 + uVar29 * 4));
              auVar40 = vfmadd231ps_avx512f(auVar40,auVar39,*(undefined1 (*) [64])(pfVar6 + uVar29))
              ;
              *(undefined1 (*) [64])(pfVar7 + uVar29) = auVar40;
              uVar29 = uVar29 + 0x10;
            } while ((long)uVar29 < (long)uVar22);
          }
          if ((long)uVar22 < (long)uVar25) {
            do {
              auVar66 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar22]),ZEXT416((uint)rVar1),
                                         ZEXT416(*(uint *)(lVar11 + uVar22 * 4)));
              pfVar7[uVar22] = auVar66._0_4_ + pfVar7[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar25 != uVar22);
          }
          p_Var20 = p_Var20->_M_nxt;
        } while (p_Var20 != (_Hash_node_base *)0x0);
      }
      local_98 = (ulong)((int)local_98 + 1);
      LookupParameters::clear(this_01);
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
      ppLVar21 = ppLVar21 + 1;
    } while (ppLVar21 != local_38);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_00228bec:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>]"
  ;
  goto LAB_00228c18;
LAB_00228c03:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
  ;
LAB_00228c18:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void MomentumSGDTrainer::update(real scale) {
  // executed on the first iteration to create vectors to
  // store the velocity
  if (!velocity_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    velocity_allocated = true;
  }

  const float gscale = clip_gradients();
  unsigned pi = 0;
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    v.vec() = momentum * v.vec() - (eta * scale * gscale) * (p->g.vec());
    p->values.vec() += v.vec() - reg;
    p->clear();
  }
  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = (p->values[i].vec()) * lambda;
      v.vec() = momentum * v.vec() - (eta * scale * gscale) * (p->grads[i].vec());
      p->values[i].vec() += v.vec() - reg;
    }
    p->clear();
  }
  ++updates;
}